

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnElemSegmentElemExpr_RefFunc
          (BinaryReaderIR *this,Index segment_index,Index func_index)

{
  pointer ppEVar1;
  ElemSegment *pEVar2;
  char *__s;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 aVar3;
  _func_int ***ppp_Var4;
  Expr *pEVar5;
  Location loc;
  intrusive_list<wabt::Expr> local_a8;
  Location local_90;
  Var local_70;
  
  ppEVar1 = (this->module_->elem_segments).
            super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (((long)(this->module_->elem_segments).
             super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>._M_impl.
             super__Vector_impl_data._M_finish - (long)ppEVar1 >> 3) - 1U != (ulong)segment_index) {
    __assert_fail("segment_index == module_->elem_segments.size() - 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/binary-reader-ir.cc"
                  ,0x524,
                  "virtual Result wabt::(anonymous namespace)::BinaryReaderIR::OnElemSegmentElemExpr_RefFunc(Index, Index)"
                 );
  }
  pEVar2 = ppEVar1[segment_index];
  __s = this->filename_;
  aVar3.offset = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  local_90.field_1.field_0.last_column = 0;
  local_90.filename._M_len = strlen(__s);
  local_90.filename._M_str = __s;
  local_90.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)aVar3.offset;
  Var::Var(&local_70,func_index,&local_90);
  pEVar5 = (Expr *)operator_new(0x88);
  (pEVar5->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
  (pEVar5->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
  (pEVar5->loc).filename._M_len = local_90.filename._M_len;
  (pEVar5->loc).filename._M_str = local_90.filename._M_str;
  (pEVar5->loc).field_1.field_1.offset = (size_t)local_90.field_1.field_1.offset;
  *(ulong *)((long)&(pEVar5->loc).field_1 + 8) =
       CONCAT44(local_90.field_1._12_4_,local_90.field_1.field_0.last_column);
  pEVar5->type_ = RefFunc;
  pEVar5->_vptr_Expr = (_func_int **)&PTR__VarExpr_001666c0;
  Var::Var((Var *)(pEVar5 + 1),&local_70);
  if (((pEVar5->super_intrusive_list_base<wabt::Expr>).prev_ == (Expr *)0x0) &&
     ((pEVar5->super_intrusive_list_base<wabt::Expr>).next_ == (Expr *)0x0)) {
    local_a8.size_ = 1;
    local_a8.first_ = pEVar5;
    local_a8.last_ = pEVar5;
    Var::~Var(&local_70);
    std::vector<wabt::intrusive_list<wabt::Expr>,std::allocator<wabt::intrusive_list<wabt::Expr>>>::
    emplace_back<wabt::intrusive_list<wabt::Expr>>
              ((vector<wabt::intrusive_list<wabt::Expr>,std::allocator<wabt::intrusive_list<wabt::Expr>>>
                *)&pEVar2->elem_exprs,&local_a8);
    pEVar5 = local_a8.first_;
    while (pEVar5 != (Expr *)0x0) {
      ppp_Var4 = &pEVar5->_vptr_Expr;
      pEVar5 = (pEVar5->super_intrusive_list_base<wabt::Expr>).next_;
      (*(*ppp_Var4)[1])();
    }
    return (Result)Ok;
  }
  __assert_fail("node->prev_ == nullptr && node->next_ == nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/intrusive-list.h"
                ,0x1bd,
                "void wabt::intrusive_list<wabt::Expr>::push_back(std::unique_ptr<T>) [T = wabt::Expr]"
               );
}

Assistant:

Result BinaryReaderIR::OnElemSegmentElemExpr_RefFunc(Index segment_index,
                                                     Index func_index) {
  assert(segment_index == module_->elem_segments.size() - 1);
  ElemSegment* segment = module_->elem_segments[segment_index];
  Location loc = GetLocation();
  ExprList init_expr;
  init_expr.push_back(std::make_unique<RefFuncExpr>(Var(func_index, loc), loc));
  segment->elem_exprs.push_back(std::move(init_expr));
  return Result::Ok;
}